

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFieldSwitch
          (ParseFunctionGenerator *this,Formatter *format,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *ordered_fields)

{
  WireType WVar1;
  int iVar2;
  FieldDescriptor *field;
  ParseFunctionGenerator *pPVar3;
  bool bVar4;
  LogMessage *other;
  WireType WVar5;
  WireType WVar6;
  pointer ppFVar7;
  int tag_size;
  uint32_t tag;
  undefined8 local_90;
  FieldDescriptor *local_88;
  uint local_80;
  uint local_7c;
  ParseFunctionGenerator *local_78;
  pointer local_70;
  LogMessage local_68;
  
  Formatter::operator()<>(format,"switch (tag >> 3) {\n");
  io::Printer::Indent(format->printer_);
  ppFVar7 = (ordered_fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (ordered_fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pPVar3 = this;
  if (ppFVar7 != local_70) {
    do {
      local_78 = pPVar3;
      field = *ppFVar7;
      PrintFieldComment<google::protobuf::FieldDescriptor>(format,field);
      local_90 = (code *)CONCAT44(local_90._4_4_,*(undefined4 *)(field + 4));
      Formatter::operator()(format,"case $1$:\n",(int *)&local_90);
      io::Printer::Indent(format->printer_);
      if ((~(byte)field[1] & 0x60) == 0) {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_90 = FieldDescriptor::TypeOnceInit;
          local_88 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_90,
                     &local_88);
        }
        if (0xfffffffb < (byte)field[2] - 0xd) goto LAB_002bb1a4;
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_90 = FieldDescriptor::TypeOnceInit;
          local_88 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_90,
                     &local_88);
        }
        WVar5 = *(WireType *)
                 (internal::WireFormatLite::kWireTypeForFieldType + (ulong)(byte)field[2] * 4);
        iVar2 = *(int *)(field + 4);
        if (WVar5 == WIRETYPE_LENGTH_DELIMITED) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                     ,0x3b9);
          other = internal::LogMessage::operator<<
                            (&local_68,
                             "CHECK failed: expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED: "
                            );
          internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        WVar5 = iVar2 << 3 | WVar5;
        WVar1 = *(int *)(field + 4) * 8 + WIRETYPE_LENGTH_DELIMITED;
        bVar4 = FieldDescriptor::is_packed(field);
        this = local_78;
        WVar6 = WVar1;
        if (!bVar4) {
          WVar6 = WVar5;
          WVar5 = WVar1;
        }
      }
      else {
LAB_002bb1a4:
        bVar4 = FieldDescriptor::is_packed(field);
        WVar5 = WIRETYPE_LENGTH_DELIMITED;
        if (!bVar4) {
          if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
            local_90 = FieldDescriptor::TypeOnceInit;
            local_88 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_90,
                       &local_88);
          }
          WVar5 = *(WireType *)
                   (internal::WireFormatLite::kWireTypeForFieldType + (ulong)(byte)field[2] * 4);
        }
        WVar6 = *(int *)(field + 4) << 3 | WVar5;
        WVar5 = WIRETYPE_VARINT;
      }
      local_90 = (code *)(CONCAT44(local_90._4_4_,WVar6) & 0xffffffff000000ff);
      Formatter::operator()
                (format,"if (PROTOBUF_PREDICT_TRUE(static_cast<$uint8$>(tag) == $1$)) {\n",
                 (uint *)&local_90);
      io::Printer::Indent(format->printer_);
      WVar6 = WVar6 & (WIRETYPE_END_GROUP|WIRETYPE_START_GROUP);
      local_7c = WVar6 + *(int *)(field + 4) * 8;
      iVar2 = 0x1f;
      if ((local_7c | 1) != 0) {
        for (; (local_7c | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      local_80 = iVar2 * 9 + 0x49U >> 6;
      if ((*(int *)(field + 4) < 0x800) && ((~(byte)field[1] & 0x60) == 0)) {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_90 = FieldDescriptor::TypeOnceInit;
          local_88 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_90,
                     &local_88);
        }
        if ((WVar6 == WIRETYPE_LENGTH_DELIMITED) && (3 < (byte)field[2] - 9)) goto LAB_002bb297;
        Formatter::operator()(format,"ptr -= $1$;\ndo {\n  ptr += $1$;\n",(int *)&local_80);
        io::Printer::Indent(format->printer_);
        GenerateFieldBody(this,format,WVar6,field);
        io::Printer::Outdent(format->printer_);
        Formatter::operator()
                  (format,
                   "  if (!ctx->DataAvailable(ptr)) break;\n} while (::$proto_ns$::internal::ExpectTag<$1$>(ptr));\n"
                   ,&local_7c);
      }
      else {
LAB_002bb297:
        GenerateFieldBody(this,format,WVar6,field);
      }
      io::Printer::Outdent(format->printer_);
      if (WVar5 != WIRETYPE_VARINT) {
        local_90 = (code *)(CONCAT44(local_90._4_4_,WVar5) & 0xffffffff000000ff);
        Formatter::operator()
                  (format,"} else if (static_cast<$uint8$>(tag) == $1$) {\n",(uint *)&local_90);
        io::Printer::Indent(format->printer_);
        GenerateFieldBody(this,format,WVar5 & (WIRETYPE_END_GROUP|WIRETYPE_START_GROUP),field);
        io::Printer::Outdent(format->printer_);
      }
      Formatter::operator()<>(format,"} else\n  goto handle_unusual;\n$next_tag$;\n");
      io::Printer::Outdent(format->printer_);
      ppFVar7 = ppFVar7 + 1;
      pPVar3 = local_78;
    } while (ppFVar7 != local_70);
  }
  Formatter::operator()<>(format,"default:\n  goto handle_unusual;\n");
  io::Printer::Outdent(format->printer_);
  Formatter::operator()<>(format,"}  // switch\n");
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFieldSwitch(
    Formatter& format,
    const std::vector<const FieldDescriptor*>& ordered_fields) {
  format("switch (tag >> 3) {\n");
  format.Indent();

  for (const auto* field : ordered_fields) {
    PrintFieldComment(format, field);
    format("case $1$:\n", field->number());
    format.Indent();
    uint32_t fallback_tag = 0;
    uint32_t expected_tag = ExpectedTag(field, &fallback_tag);
    format("if (PROTOBUF_PREDICT_TRUE(static_cast<$uint8$>(tag) == $1$)) {\n",
           expected_tag & 0xFF);
    format.Indent();
    auto wiretype = WireFormatLite::GetTagWireType(expected_tag);
    uint32_t tag = WireFormatLite::MakeTag(field->number(), wiretype);
    int tag_size = io::CodedOutputStream::VarintSize32(tag);
    bool is_repeat = ShouldRepeat(field, wiretype);
    if (is_repeat) {
      format(
          "ptr -= $1$;\n"
          "do {\n"
          "  ptr += $1$;\n",
          tag_size);
      format.Indent();
    }
    GenerateFieldBody(format, wiretype, field);
    if (is_repeat) {
      format.Outdent();
      format(
          "  if (!ctx->DataAvailable(ptr)) break;\n"
          "} while (::$proto_ns$::internal::ExpectTag<$1$>(ptr));\n",
          tag);
    }
    format.Outdent();
    if (fallback_tag) {
      format("} else if (static_cast<$uint8$>(tag) == $1$) {\n",
             fallback_tag & 0xFF);
      format.Indent();
      GenerateFieldBody(format, WireFormatLite::GetTagWireType(fallback_tag),
                        field);
      format.Outdent();
    }
    format(
        "} else\n"
        "  goto handle_unusual;\n"
        "$next_tag$;\n");
    format.Outdent();
  }  // for loop over ordered fields

  format(
      "default:\n"
      "  goto handle_unusual;\n");
  format.Outdent();
  format("}  // switch\n");
}